

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TheoryAxioms.cpp
# Opt level: O3

void __thiscall Shell::TheoryAxioms::addDiscriminationAxiom(TheoryAxioms *this,TermAlgebra *ta)

{
  TermAlgebraConstructor *pTVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  TermList *res;
  Term *pTVar4;
  uint c;
  uint64_t uVar5;
  ulong uVar6;
  TermAlgebra *pTVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  initializer_list<Kernel::Literal_*> lits;
  TermStack args;
  Array<Kernel::TermList> cases;
  TermStack variables;
  Stack<Kernel::TermList> local_98;
  TermAlgebra *local_78;
  Array<Kernel::TermList> local_70;
  Array<Shell::TermAlgebraConstructor_*> *local_58;
  Stack<Kernel::TermList> local_50;
  
  uVar5 = (ta->_sort)._content;
  uVar10 = (ulong)*(uint *)(uVar5 + 0xc) & 0xfffffff;
  local_98._capacity = uVar10;
  local_78 = ta;
  if ((*(uint *)(uVar5 + 0xc) & 0xfffffff) == 0) {
    local_98._stack = (TermList *)0x0;
    uVar10 = 0;
  }
  else {
    uVar8 = (int)uVar10 * 8 + 0xfU & 0xfffffff0;
    if (uVar8 == 0) {
      local_98._stack =
           (TermList *)
           Lib::FixedSizeAllocator<8UL>::alloc
                     ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar8 < 0x11) {
      local_98._stack =
           (TermList *)
           Lib::FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar8 < 0x19) {
      local_98._stack =
           (TermList *)
           Lib::FixedSizeAllocator<24UL>::alloc
                     ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar8 < 0x21) {
      local_98._stack =
           (TermList *)
           Lib::FixedSizeAllocator<32UL>::alloc
                     ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar8 < 0x31) {
      local_98._stack =
           (TermList *)
           Lib::FixedSizeAllocator<48UL>::alloc
                     ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar8 < 0x41) {
      local_98._stack =
           (TermList *)
           Lib::FixedSizeAllocator<64UL>::alloc
                     ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      local_98._stack = (TermList *)::operator_new((ulong)uVar8,0x10);
    }
    uVar5 = (ta->_sort)._content;
  }
  local_98._end = local_98._stack + uVar10;
  local_98._cursor = local_98._stack;
  if ((*(uint *)(uVar5 + 0xc) & 0xfffffff) != 0) {
    uVar5 = 1;
    uVar8 = 0;
    do {
      if (local_98._cursor == local_98._end) {
        Lib::Stack<Kernel::TermList>::expand(&local_98);
      }
      (local_98._cursor)->_content = uVar5;
      local_98._cursor = local_98._cursor + 1;
      uVar5 = uVar5 + 4;
      uVar8 = uVar8 + 1;
    } while (uVar8 < (*(uint *)((local_78->_sort)._content + 0xc) & 0xfffffff));
  }
  pTVar7 = local_78;
  uVar10 = (ulong)local_78->_n;
  local_70._vptr_Array = (_func_int **)&PTR_fillInterval_00b472c0;
  local_70._capacity = uVar10;
  if (uVar10 == 0) {
    local_70._array = (TermList *)0x0;
  }
  else {
    uVar9 = uVar10 * 8 + 0xf & 0xffffffff0;
    if (uVar9 == 0) {
      local_70._array =
           (TermList *)
           Lib::FixedSizeAllocator<8UL>::alloc
                     ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar9 < 0x11) {
      local_70._array =
           (TermList *)
           Lib::FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar9 < 0x19) {
      local_70._array =
           (TermList *)
           Lib::FixedSizeAllocator<24UL>::alloc
                     ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar9 < 0x21) {
      local_70._array =
           (TermList *)
           Lib::FixedSizeAllocator<32UL>::alloc
                     ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar9 < 0x31) {
      local_70._array =
           (TermList *)
           Lib::FixedSizeAllocator<48UL>::alloc
                     ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar9 < 0x41) {
      local_70._array =
           (TermList *)
           Lib::FixedSizeAllocator<64UL>::alloc
                     ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      local_70._array = (TermList *)::operator_new(uVar9,0x10);
    }
    auVar3 = _DAT_0084f040;
    auVar2 = _DAT_0084f030;
    lVar11 = uVar10 - 1;
    auVar12._8_4_ = (int)lVar11;
    auVar12._0_8_ = lVar11;
    auVar12._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar9 = 0;
    auVar12 = auVar12 ^ _DAT_0084f040;
    do {
      auVar13._8_4_ = (int)uVar9;
      auVar13._0_8_ = uVar9;
      auVar13._12_4_ = (int)(uVar9 >> 0x20);
      auVar13 = (auVar13 | auVar2) ^ auVar3;
      if ((bool)(~(auVar13._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar13._0_4_ ||
                  auVar12._4_4_ < auVar13._4_4_) & 1)) {
        local_70._array[uVar9]._content = 2;
      }
      if ((auVar13._12_4_ != auVar12._12_4_ || auVar13._8_4_ <= auVar12._8_4_) &&
          auVar13._12_4_ <= auVar12._12_4_) {
        local_70._array[uVar9 + 1]._content = 2;
      }
      uVar9 = uVar9 + 2;
    } while ((uVar10 + 1 & 0xfffffffffffffffe) != uVar9);
    if (pTVar7->_n != 0) {
      local_58 = &pTVar7->_constrs;
      uVar10 = 0;
      do {
        if ((pTVar7->_constrs)._capacity <= uVar10) {
          Lib::Array<Shell::TermAlgebraConstructor_*>::expandToFit(local_58,uVar10);
        }
        pTVar1 = (pTVar7->_constrs)._array[uVar10];
        Lib::Stack<Kernel::TermList>::Stack(&local_50,&local_98);
        uVar8 = TermAlgebraConstructor::numTypeArguments(pTVar1);
        uVar6 = (ulong)uVar8;
        uVar9 = uVar6 * 4;
        while( true ) {
          uVar8 = TermAlgebraConstructor::arity(pTVar1);
          if (uVar8 <= uVar6) break;
          if (local_50._cursor == local_50._end) {
            Lib::Stack<Kernel::TermList>::expand(&local_50);
          }
          (local_50._cursor)->_content = (uVar9 & 0xffffffff) + 1;
          local_50._cursor = local_50._cursor + 1;
          uVar6 = uVar6 + 1;
          uVar9 = uVar9 + 4;
        }
        pTVar4 = Kernel::Term::create
                           (pTVar1->_functor,
                            (uint)((ulong)((long)local_50._cursor - (long)local_50._stack) >> 3),
                            local_50._stack);
        if (local_70._capacity <= uVar10) {
          Lib::Array<Kernel::TermList>::expandToFit(&local_70,uVar10);
        }
        pTVar7 = local_78;
        local_70._array[uVar10]._content = (uint64_t)pTVar4;
        if (local_50._stack != (TermList *)0x0) {
          uVar9 = local_50._capacity * 8 + 0xf & 0xfffffffffffffff0;
          if (uVar9 == 0) {
            (local_50._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_50._stack;
          }
          else if (uVar9 < 0x11) {
            (local_50._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_50._stack;
          }
          else if (uVar9 < 0x19) {
            (local_50._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_50._stack;
          }
          else if (uVar9 < 0x21) {
            (local_50._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_50._stack;
          }
          else if (uVar9 < 0x31) {
            (local_50._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_50._stack;
          }
          else if (uVar9 < 0x41) {
            (local_50._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_50._stack;
          }
          else {
            operator_delete(local_50._stack,0x10);
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < pTVar7->_n);
      if (pTVar7->_n != 0) {
        uVar10 = 0;
        do {
          if ((pTVar7->_constrs)._capacity <= uVar10) {
            Lib::Array<Shell::TermAlgebraConstructor_*>::expandToFit(local_58,uVar10);
          }
          pTVar1 = (pTVar7->_constrs)._array[uVar10];
          if ((pTVar1->_hasDiscriminator == true) && (local_70._capacity != 0)) {
            uVar9 = 0;
            do {
              uVar5 = local_70._array[uVar9]._content;
              if (local_98._cursor == local_98._end) {
                Lib::Stack<Kernel::TermList>::expand(&local_98);
              }
              (local_98._cursor)->_content = uVar5;
              local_98._cursor = local_98._cursor + 1;
              uVar8 = TermAlgebraConstructor::discriminator(pTVar1);
              local_50._capacity =
                   (size_t)Kernel::Literal::create
                                     (uVar8,(uint)((ulong)((long)local_98._cursor -
                                                          (long)local_98._stack) >> 3),
                                      uVar10 == uVar9,local_98._stack);
              local_98._cursor = local_98._cursor + -1;
              lits._M_len = 1;
              lits._M_array = (iterator)&local_50;
              addTheoryClauseFromLits(this,lits,TERM_ALGEBRA_DISCRIMINATION_AXIOM,0);
              uVar9 = (ulong)((int)uVar9 + 1);
            } while (uVar9 < local_70._capacity);
          }
          uVar10 = uVar10 + 1;
          pTVar7 = local_78;
        } while (uVar10 < local_78->_n);
      }
    }
  }
  Lib::Array<Kernel::TermList>::~Array(&local_70);
  if (local_98._stack != (TermList *)0x0) {
    uVar10 = local_98._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar10 == 0) {
      (local_98._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_98._stack;
    }
    else if (uVar10 < 0x11) {
      (local_98._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_98._stack;
    }
    else if (uVar10 < 0x19) {
      (local_98._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_98._stack;
    }
    else if (uVar10 < 0x21) {
      (local_98._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_98._stack;
    }
    else if (uVar10 < 0x31) {
      (local_98._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_98._stack;
    }
    else if (uVar10 < 0x41) {
      (local_98._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_98._stack;
    }
    else {
      operator_delete(local_98._stack,0x10);
    }
  }
  return;
}

Assistant:

void TheoryAxioms::addDiscriminationAxiom(TermAlgebra* ta) {
  TermStack args(ta->nTypeArgs());
  unsigned v = 0;
  for (unsigned i = 0; i < ta->nTypeArgs(); i++) {
    args.push(TermList(v++,false));
  }
  Array<TermList> cases(ta->nConstructors());
  for (unsigned i = 0; i < ta->nConstructors(); i++) {
    TermAlgebraConstructor* c = ta->constructor(i);

    TermStack variables = args;
    for (unsigned var = c->numTypeArguments(); var < c->arity(); var++) {
      variables.push(TermList(var, false));
    }

    TermList term(Term::create(c->functor(), (unsigned)variables.size(), variables.begin()));
    cases[i] = term;
  }

  for (unsigned i = 0; i < ta->nConstructors(); i++) {
    TermAlgebraConstructor* constructor = ta->constructor(i);

    if (!constructor->hasDiscriminator()) continue;

    for (unsigned c = 0; c < cases.size(); c++) {
      args.push(cases[c]);
      Literal* lit = Literal::create(constructor->discriminator(), args.size(), c == i, args.begin());
      args.pop();
      addTheoryClauseFromLits({lit}, InferenceRule::TERM_ALGEBRA_DISCRIMINATION_AXIOM,CHEAP);
    }
  }
}